

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O0

void __thiscall
supermap::
Supermap<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
::add(Supermap<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
      *this,Key<30UL> *key,MaybeRemovedValue<supermap::ByteArray<100UL>_> *value)

{
  int iVar1;
  pointer pKVar2;
  pointer pEVar3;
  undefined4 extraout_var;
  unsigned_long uVar4;
  undefined4 extraout_var_00;
  MaybeRemovedValue<supermap::ByteArray<100UL>_> *in_RSI;
  Key<30UL> *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double notSortedPart;
  unsigned_long totalStorageSize;
  unsigned_long notSortedStorageSize;
  Supermap<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
  *in_stack_00000060;
  OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
  *in_stack_ffffffffffffff80;
  unsigned_long local_38 [3];
  undefined1 local_20 [16];
  Key<30UL> *__args;
  
  __args = in_RDI;
  pKVar2 = std::
           unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
           ::operator->((unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
                         *)0x12a41f);
  std::
  make_unique<supermap::KeyValue<supermap::Key<30ul>,supermap::MaybeRemovedValue<supermap::ByteArray<100ul>>>,supermap::Key<30ul>const&,supermap::MaybeRemovedValue<supermap::ByteArray<100ul>>&>
            (__args,in_RSI);
  (**(pKVar2->
     super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
     ).
     super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
     ._vptr_OrderedStorage)(pKVar2,local_20);
  std::
  unique_ptr<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_std::default_delete<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>_>_>
  ::~unique_ptr((unique_ptr<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_std::default_delete<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>_>_>
                 *)in_stack_ffffffffffffff80);
  pEVar3 = std::
           unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>_>_>
           ::operator->((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>_>_>
                         *)0x12a469);
  std::
  unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
  ::operator->((unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
                *)0x12a486);
  local_38[0] = OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
                ::getLastElementIndex(in_stack_ffffffffffffff80);
  (**(pEVar3->super_KeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>).
     _vptr_KeyValueStorage)(pEVar3,in_RSI,local_38);
  pEVar3 = std::
           unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>_>_>
           ::operator->((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>_>_>
                         *)0x12a4b5);
  iVar1 = (*(pEVar3->super_KeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>).
            _vptr_KeyValueStorage[3])();
  if (*(ulong *)(in_RDI[4].super_array<unsigned_char,_30UL>._M_elems + 8) <=
      CONCAT44(extraout_var,iVar1)) {
    dropRamIndexToDisk(in_stack_00000060);
  }
  std::
  unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
  ::operator->((unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
                *)0x12a508);
  uVar4 = KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
          ::getNotSortedItemsCount
                    ((KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                      *)0x12a510);
  pKVar2 = std::
           unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
           ::operator->((unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
                         *)0x12a51f);
  iVar1 = (*(pKVar2->
            super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
            ).
            super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
            ._vptr_OrderedStorage[1])();
  auVar6._4_4_ = extraout_var_00;
  auVar6._0_4_ = iVar1;
  auVar5._8_4_ = (int)(uVar4 >> 0x20);
  auVar5._0_8_ = uVar4;
  auVar5._12_4_ = 0x45300000;
  auVar6._8_4_ = extraout_var_00;
  auVar6._12_4_ = 0x45300000;
  if (*(double *)(in_RDI[0xac].super_array<unsigned_char,_30UL>._M_elems + 8) <=
      ((auVar5._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) /
      ((auVar6._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0))) {
    dropRamIndexToDisk(in_stack_00000060);
    shrinkDataStorage((Supermap<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
                       *)value);
  }
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        diskDataStorage_->append(std::make_unique<KeyVal>(key, value));
        innerStorage_->add(key, diskDataStorage_->getLastElementIndex());
        if (innerStorage_->getUpperSizeBound() >= keyIndexBatchSize_) {
            dropRamIndexToDisk();
        }

        IndexT notSortedStorageSize = diskDataStorage_->getNotSortedItemsCount();
        IndexT totalStorageSize = diskDataStorage_->getItemsCount();

        double notSortedPart = static_cast<double>(notSortedStorageSize) / static_cast<double>(totalStorageSize);

        if (notSortedPart >= maxNotSortedPart_) {
            dropRamIndexToDisk();
            shrinkDataStorage();
        }
    }